

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_ExtraPluginParameters_Test::
TestBody(CommandLineInterfaceTest_ExtraPluginParameters_Test *this)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view contents;
  allocator<char> local_d5;
  allocator<char> local_d4;
  allocator<char> local_d3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str = "syntax = \"proto2\";\nmessage Foo {}\n";
  contents._M_len = 0x22;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  name_00._M_str = "a";
  name_00._M_len = 1;
  CommandLineInterfaceTester::CreateTempDir((CommandLineInterfaceTester *)this,name_00);
  name_01._M_str = "b";
  name_01._M_len = 1;
  CommandLineInterfaceTester::CreateTempDir((CommandLineInterfaceTester *)this,name_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "protocol_compiler --plug_opt=foo1 --plug_out=bar:$tmpdir/a --plug_opt=foo2 --plug_out=baz:$tmpdir/b --plug_opt=foo3 --proto_path=$tmpdir foo.proto"
             ,(allocator<char> *)&local_d0);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"test_plugin",&local_d1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"bar,foo1,foo2,foo3",&local_d2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo.proto",&local_d3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Foo",&local_d4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"a",&local_d5);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_d0,&local_50,&local_70,&local_90,&local_b0
            );
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"test_plugin",&local_d1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"baz,foo1,foo2,foo3",&local_d2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"foo.proto",&local_d3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Foo",&local_d4);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"b",&local_d5);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_d0,&local_50,&local_70,&local_90,&local_b0
            );
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, ExtraPluginParameters) {
  // Test that generator parameters specified with the option flag are
  // correctly passed to the code generator.

  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");
  // Create the "a" and "b" sub-directories.
  CreateTempDir("a");
  CreateTempDir("b");

  Run("protocol_compiler "
      "--plug_opt=foo1 "
      "--plug_out=bar:$tmpdir/a "
      "--plug_opt=foo2 "
      "--plug_out=baz:$tmpdir/b "
      "--plug_opt=foo3 "
      "--proto_path=$tmpdir foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_plugin", "bar,foo1,foo2,foo3", "foo.proto", "Foo", "a");
  ExpectGenerated("test_plugin", "baz,foo1,foo2,foo3", "foo.proto", "Foo", "b");
}